

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O3

void __thiscall embree::sse2::BVHNBuilderSAHGrid<4>::build(BVHNBuilderSAHGrid<4> *this)

{
  bool bVar1;
  BVH *pBVar2;
  pointer ppTVar3;
  Device *pDVar4;
  Block *pBVar5;
  PrimRef *pPVar6;
  MemoryMonitorInterface *pMVar7;
  GridMesh *pGVar8;
  BVHN<4> *this_00;
  SubGridBuildData *pSVar9;
  double t0;
  double dVar10;
  long lVar11;
  long *plVar12;
  ulong uVar13;
  NodeRef root;
  long *plVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *primrefarray_i;
  __pointer_type pBVar16;
  pointer ppTVar17;
  ulong uVar18;
  size_t sVar19;
  float fVar20;
  string __str;
  PrimInfo pinfo;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  size_type local_78;
  undefined8 uStack_70;
  long local_48;
  long local_40;
  
  if ((this->mesh != (GridMesh *)0x0) &&
     ((this->mesh->super_Geometry).numPrimitives != this->numPreviousPrimitives)) {
    pBVar2 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar2->alloc);
    ppTVar17 = (pBVar2->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppTVar3 = (pBVar2->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar17 != ppTVar3) {
      do {
        FastAllocator::ThreadLocal2::unbind(*ppTVar17,&pBVar2->alloc);
        ppTVar17 = ppTVar17 + 1;
      } while (ppTVar17 != ppTVar3);
      ppTVar17 = (pBVar2->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((pBVar2->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppTVar17) {
        (pBVar2->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppTVar17;
      }
    }
    LOCK();
    (pBVar2->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar2->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar2->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar2->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar4 = (pBVar2->alloc).device;
      bVar1 = (pBVar2->alloc).useUSM;
      pBVar16 = (pBVar2->alloc).usedBlocks._M_b._M_p;
      do {
        pBVar5 = pBVar16->next;
        FastAllocator::Block::clear_block(pBVar16,pDVar4,bVar1);
        pBVar16 = pBVar5;
      } while (pBVar5 != (Block *)0x0);
    }
    LOCK();
    (pBVar2->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar2->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar4 = (pBVar2->alloc).device;
      bVar1 = (pBVar2->alloc).useUSM;
      pBVar16 = (pBVar2->alloc).freeBlocks._M_b._M_p;
      do {
        pBVar5 = pBVar16->next;
        FastAllocator::Block::clear_block(pBVar16,pDVar4,bVar1);
        pBVar16 = pBVar5;
      } while (pBVar5 != (Block *)0x0);
    }
    LOCK();
    (pBVar2->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar11 = -8;
    do {
      LOCK();
      (pBVar2->alloc).threadBlocks[lVar11]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      LOCK();
      (pBVar2->alloc).threadBlocks[lVar11 + 8]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0);
    sVar19 = (pBVar2->alloc).primrefarray.size_alloced;
    pPVar6 = (pBVar2->alloc).primrefarray.items;
    if (pPVar6 != (PrimRef *)0x0) {
      if (sVar19 << 5 < 0x1c00000) {
        alignedFree(pPVar6);
      }
      else {
        os_free(pPVar6,sVar19 << 5,(pBVar2->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar19 != 0) {
      pMVar7 = (pBVar2->alloc).primrefarray.alloc.device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar19 * -0x20,1);
    }
    (pBVar2->alloc).primrefarray.size_active = 0;
    (pBVar2->alloc).primrefarray.size_alloced = 0;
    (pBVar2->alloc).primrefarray.items = (PrimRef *)0x0;
  }
  if ((this->settings).primrefarrayalloc != 0xffffffffffffffff) {
    FastAllocator::unshare(&this->bvh->alloc,(int)this + 0x28);
  }
  pGVar8 = this->mesh;
  if (pGVar8 == (GridMesh *)0x0) {
    this->numPreviousPrimitives = (uint)(this->scene->world).numGrids;
    createPrimRefArrayGrids((PrimInfo *)&local_88.field_1,this->scene,&this->prims,&this->sgrids);
  }
  else {
    this->numPreviousPrimitives = (pGVar8->super_Geometry).numPrimitives;
    createPrimRefArrayGrids((PrimInfo *)&local_88.field_1,pGVar8,&this->prims,&this->sgrids);
  }
  this_00 = this->bvh;
  uVar18 = local_40 - local_48;
  if (uVar18 == 0) {
    (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
    sVar19 = (this->prims).size_alloced;
    pPVar6 = (this->prims).items;
    if (pPVar6 != (PrimRef *)0x0) {
      if (sVar19 << 5 < 0x1c00000) {
        alignedFree(pPVar6);
      }
      else {
        os_free(pPVar6,sVar19 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar19 != 0) {
      pMVar7 = (this->prims).alloc.device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar19 * -0x20,1);
    }
    (this->prims).size_active = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
    sVar19 = (this->sgrids).size_alloced;
    pSVar9 = (this->sgrids).items;
    if (pSVar9 != (SubGridBuildData *)0x0) {
      if (sVar19 * 8 < 0x1c00000) {
        alignedFree(pSVar9);
      }
      else {
        os_free(pSVar9,sVar19 * 8,(this->sgrids).alloc.hugepages);
      }
    }
    if (sVar19 != 0) {
      pMVar7 = (this->sgrids).alloc.device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar19 * -8,1);
    }
    (this->sgrids).size_active = 0;
    (this->sgrids).size_alloced = 0;
    (this->sgrids).items = (SubGridBuildData *)0x0;
  }
  else {
    pGVar8 = this->mesh;
    if (pGVar8 == (GridMesh *)0x0) {
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,'\x01');
      *local_a8[0] = 0x34;
      plVar12 = (long *)std::__cxx11::string::replace((ulong)local_a8,0,(char *)0x0,0x1f8cf1e);
      local_108 = &local_f8;
      plVar14 = plVar12 + 2;
      if ((long *)*plVar12 == plVar14) {
        local_f8 = *plVar14;
        lStack_f0 = plVar12[3];
      }
      else {
        local_f8 = *plVar14;
        local_108 = (long *)*plVar12;
      }
      local_100 = plVar12[1];
      *plVar12 = (long)plVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_108);
      local_e8._0_8_ = &local_d8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar15) {
        local_d8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_d8._8_8_ = plVar12[3];
      }
      else {
        local_d8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_e8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar12;
      }
      local_e8._8_8_ = plVar12[1];
      *plVar12 = (long)paVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
    }
    else {
      local_e8._0_8_ = &local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    }
    t0 = BVHN<4>::preBuild(this_00,(string *)&local_e8.field_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._0_8_ != &local_d8) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (pGVar8 == (GridMesh *)0x0) {
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
    }
    uVar13 = 0xffffffffffffffff;
    if (999999 < uVar18) {
      uVar13 = uVar18 / 1000;
    }
    (this->settings).primrefarrayalloc = uVar13;
    if (this->mesh != (GridMesh *)0x0) {
      (this->bvh->alloc).atype = EMBREE_OS_MALLOC;
    }
    dVar10 = (double)uVar18 * 1.2 * 0.25 * 88.0;
    uVar13 = (ulong)dVar10;
    sVar19 = (uVar18 * 0xe0 >> 4) +
             ((long)(dVar10 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13);
    FastAllocator::init_estimate(&this->bvh->alloc,sVar19);
    sVar19 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,4,0x400,uVar18,sVar19);
    (this->settings).singleThreadThreshold = sVar19;
    pBVar2 = this->bvh;
    if (local_40 == local_48) {
      build();
    }
    else {
      local_d8._M_allocated_capacity = (size_type)(this->sgrids).items;
      local_e8._0_8_ = &PTR_createLeaf_0218cea8;
      local_e8._8_8_ = pBVar2;
      root = BVHNBuilderVirtual<4>::BVHNBuilderV::build
                       ((BVHNBuilderV *)&local_e8.field_1,&pBVar2->alloc,
                        &(pBVar2->scene->progressInterface).super_BuildProgressMonitor,
                        (this->prims).items,(PrimInfo *)&local_88.field_1,this->settings);
      local_e8._0_8_ = local_88._0_8_;
      local_e8._8_8_ = local_88._8_8_;
      local_d8._M_allocated_capacity = local_78;
      local_d8._8_8_ = uStack_70;
      local_c8._0_8_ = local_88._0_8_;
      local_c8._8_8_ = local_88._8_8_;
      local_b8._0_8_ = local_78;
      local_b8._8_8_ = uStack_70;
      BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_e8.field_1,local_40 - local_48);
      fVar20 = (float)(ulong)(local_40 - local_48) * 0.005;
      uVar18 = (ulong)fVar20;
      ctx = (EVP_PKEY_CTX *)((long)(fVar20 - 9.223372e+18) & (long)uVar18 >> 0x3f | uVar18);
      BVHN<4>::layoutLargeNodes(this->bvh,(size_t)ctx);
      sVar19 = (this->sgrids).size_alloced;
      pSVar9 = (this->sgrids).items;
      if (pSVar9 != (SubGridBuildData *)0x0) {
        ctx = (EVP_PKEY_CTX *)(sVar19 * 8);
        if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
          alignedFree(pSVar9);
        }
        else {
          os_free(pSVar9,(size_t)ctx,(this->sgrids).alloc.hugepages);
        }
      }
      if (sVar19 != 0) {
        pMVar7 = (this->sgrids).alloc.device;
        ctx = (EVP_PKEY_CTX *)(sVar19 * -8);
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,ctx,1);
      }
      primrefarray_i = (EVP_PKEY_CTX *)&this->prims;
      (this->sgrids).size_active = 0;
      (this->sgrids).size_alloced = 0;
      (this->sgrids).items = (SubGridBuildData *)0x0;
      if ((this->settings).primrefarrayalloc == 0xffffffffffffffff) {
        if ((this->scene != (Scene *)0x0) &&
           ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
          sVar19 = (this->prims).size_alloced;
          pPVar6 = (this->prims).items;
          if (pPVar6 != (PrimRef *)0x0) {
            ctx = (EVP_PKEY_CTX *)(sVar19 << 5);
            if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
              alignedFree(pPVar6);
            }
            else {
              os_free(pPVar6,(size_t)ctx,(this->prims).alloc.hugepages);
            }
          }
          if (sVar19 != 0) {
            pMVar7 = (((mvector<PrimRef> *)primrefarray_i)->alloc).device;
            ctx = (EVP_PKEY_CTX *)(sVar19 * -0x20);
            (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,ctx,1);
          }
          (this->prims).size_active = 0;
          (this->prims).size_alloced = 0;
          (this->prims).items = (PrimRef *)0x0;
        }
      }
      else {
        FastAllocator::share(&this->bvh->alloc,(mvector<PrimRef> *)primrefarray_i);
        ctx = primrefarray_i;
      }
      BVHN<4>::cleanup(this->bvh,ctx);
      BVHN<4>::postBuild(this->bvh,t0);
    }
  }
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }
        
        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.unshare(prims);

        const size_t numGridPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(GridMesh::geom_type,false);
        numPreviousPrimitives = numGridPrimitives;


        PrimInfo pinfo = mesh ? createPrimRefArrayGrids(mesh,prims,sgrids) : createPrimRefArrayGrids(scene,prims,sgrids);
        const size_t numPrimitives = pinfo.size();
        /* no primitives */
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          sgrids.clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + "BuilderSAH");

        /* create primref array */
        settings.primrefarrayalloc = numPrimitives/1000;
        if (settings.primrefarrayalloc < 1000)
          settings.primrefarrayalloc = inf;

        /* enable os_malloc for two level build */
        if (mesh)
          bvh->alloc.setOSallocation(true);

        /* initialize allocator */
        const size_t node_bytes = numPrimitives*sizeof(typename BVH::AABBNodeMB)/(4*N);
        const size_t leaf_bytes = size_t(1.2*(float)numPrimitives/N * sizeof(SubGridQBVHN<N>));

        bvh->alloc.init_estimate(node_bytes+leaf_bytes);
        settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);

        /* pinfo might has zero size due to invalid geometry */
        if (unlikely(pinfo.size() == 0))
        {
          bvh->clear();
          sgrids.clear();
          prims.clear();
          return;
        }

        /* call BVH builder */
        NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeafGrid<N,SubGridQBVHN<N>>(bvh,sgrids.data()),bvh->scene->progressInterface,prims.data(),pinfo,settings);
        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

        /* clear temporary array */
        sgrids.clear();

        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.share(prims);

        /* for static geometries we can do some cleanups */
        else if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }